

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O3

void free_adiak_type(adiak_datatype_t *t)

{
  int iVar1;
  long lVar2;
  
  if ((t != (adiak_datatype_t *)0x0) && ((t->dtype & ~adiak_int) == adiak_range)) {
    iVar1 = t->num_subtypes;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        free_adiak_type(t->subtype[lVar2]);
        lVar2 = lVar2 + 1;
        iVar1 = t->num_subtypes;
      } while (lVar2 < iVar1);
    }
    if (iVar1 != 0) {
      free(t->subtype);
    }
    free(t);
    return;
  }
  return;
}

Assistant:

static void free_adiak_type(adiak_datatype_t *t)
{
   int i;
   if (t == NULL)
      return;
   if (is_basetype(t->dtype))
      return;
   for (i = 0; i < t->num_subtypes; i++) {
      free_adiak_type(t->subtype[i]);
   }
   if (t->num_subtypes)
      free(t->subtype);
   free(t);
}